

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3map_io.c
# Opt level: O1

int s3map_read(char *fn,void **out_map,uint32 *out_n_dom,uint32 *out_n_rng,size_t map_elem_size)

{
  char *pcVar1;
  uint32 *puVar2;
  int iVar3;
  int32 iVar4;
  FILE *fp;
  char *pcVar5;
  uint32 swap;
  uint32 rd_chksum;
  uint32 sv_chksum;
  uint32 ignore;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar6;
  uint32 local_60;
  uint32 local_5c;
  char *local_58;
  uint32 local_4c;
  uint32 *local_48;
  size_t local_40;
  uint32 local_34;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_5c = 0;
  local_40 = map_elem_size;
  fp = s3open(fn,"rb",&local_60);
  if (fp == (FILE *)0x0) {
    return -1;
  }
  local_58 = fn;
  local_48 = out_n_dom;
  pcVar5 = s3get_gvn_fattr("version");
  if (pcVar5 == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3map_io.c"
            ,0x53,"No version attribute for %s\n",local_58);
  }
  else {
    iVar3 = strcmp(pcVar5,"1.2");
    if (iVar3 == 0) {
      pcVar5 = s3get_gvn_fattr("chksum0");
      iVar4 = bio_fread(out_n_rng,4,1,fp,local_60,&local_5c);
      puVar2 = local_48;
      if ((iVar4 == 1) &&
         (iVar4 = bio_fread_1d(out_map,local_40,local_48,fp,local_60,&local_5c), pcVar1 = local_58,
         -1 < iVar4)) {
        if (pcVar5 != (char *)0x0) {
          iVar4 = bio_fread(&local_4c,4,1,fp,local_60,&local_34);
          if (iVar4 != 1) goto LAB_0011baa7;
          if (local_4c != local_5c) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3map_io.c"
                    ,0x76,"Checksum error; read corrupted data.\n");
            goto LAB_0011bb11;
          }
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3map_io.c"
                ,0x7a,"Read %s [%u mappings to %u]\n",pcVar1,(ulong)*puVar2,
                CONCAT44(uVar6,*out_n_rng));
        return 0;
      }
LAB_0011baa7:
      s3close(fp);
      return -1;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3map_io.c"
            ,0x4f,"Version mismatch for %s, file ver: %s != reader ver: %s\n",local_58,pcVar5,"1.2")
    ;
  }
LAB_0011bb11:
  exit(1);
}

Assistant:

int
s3map_read(const char *fn,
	   void **out_map,
	   uint32 *out_n_dom,
	   uint32 *out_n_rng,
	   size_t map_elem_size)
{
    uint32 rd_chksum = 0;
    uint32 sv_chksum;
    uint32 ignore;
    char *ver;
    char *do_chk;
    FILE *fp;
    uint32 swap;

    fp = s3open(fn, "rb", &swap);
    if (fp == NULL) {
	return S3_ERROR;
    }

    /* check version id */
    ver = s3get_gvn_fattr("version");
    if (ver) {
	if (strcmp(ver, MAP_FILE_VERSION) != 0) {
	    E_FATAL("Version mismatch for %s, file ver: %s != reader ver: %s\n",
		    fn, ver, MAP_FILE_VERSION);
	}
    }
    else {
	E_FATAL("No version attribute for %s\n", fn);
    }

    do_chk = s3get_gvn_fattr("chksum0");

    if (bio_fread(out_n_rng,
	       sizeof(uint32),
	       1,
	       fp,
	       swap,
	       &rd_chksum) != 1) {
	s3close(fp);

	return S3_ERROR;
    }

    if (bio_fread_1d(out_map,
		  map_elem_size,
		  out_n_dom,
		  fp,
		  swap,
		  &rd_chksum) < 0) {
	s3close(fp);

	return S3_ERROR;
    }

    if (do_chk) {
	if (bio_fread(&sv_chksum, sizeof(uint32), 1, fp, swap, &ignore) != 1) {
	    s3close(fp);
	    
	    return S3_ERROR;
	}
	
	if (sv_chksum != rd_chksum) {
	    E_FATAL("Checksum error; read corrupted data.\n");
	}
    }

    E_INFO("Read %s [%u mappings to %u]\n", fn, *out_n_dom, *out_n_rng);

    return S3_SUCCESS;
}